

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

_Bool swap_commutative(TCGArg dest,TCGArg *p1,TCGArg *p2)

{
  byte bVar1;
  TCGArg TVar2;
  TCGArg TVar3;
  _Bool _Var4;
  
  TVar2 = *p1;
  TVar3 = *p2;
  bVar1 = **(byte **)(TVar2 + 0x30);
  if ((**(byte **)(TVar3 + 0x30) < bVar1) ||
     ((_Var4 = false, TVar3 == dest && (bVar1 == **(byte **)(TVar3 + 0x30))))) {
    *p1 = TVar3;
    *p2 = TVar2;
    _Var4 = true;
  }
  return _Var4;
}

Assistant:

static bool swap_commutative(TCGArg dest, TCGArg *p1, TCGArg *p2)
{
    TCGArg a1 = *p1, a2 = *p2;
    int sum = 0;
    sum += arg_is_const(a1);
    sum -= arg_is_const(a2);

    /* Prefer the constant in second argument, and then the form
       op a, a, b, which is better handled on non-RISC hosts. */
    if (sum > 0 || (sum == 0 && dest == a2)) {
        *p1 = a2;
        *p2 = a1;
        return true;
    }
    return false;
}